

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O3

int Abc_CommandRetime(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int *__src;
  int iVar1;
  Wln_Ntk_t *pNtk;
  Vec_Int_t *__ptr;
  int *piVar2;
  FILE *__stream;
  char *pcVar3;
  uint fVerbose;
  uint fSkipSimple;
  char *pcVar4;
  uint fDump;
  
  fSkipSimple = 0;
  Extra_UtilGetoptReset();
  fDump = 0;
  fVerbose = 0;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"sdvh"), iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) break;
    if (iVar1 == 100) {
      fDump = fDump ^ 1;
    }
    else {
      if (iVar1 != 0x73) {
        Abc_Print(-2,"usage: %%retime [-sdvh]\n");
        Abc_Print(-2,"\t         performs retiming for the NDR design\n");
        pcVar4 = "yes";
        pcVar3 = "no";
        if (fSkipSimple == 0) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,"\t-s     : toggle printing simple nodes [default = %s]\n",pcVar3);
        pcVar3 = "yes";
        if (fDump == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-d     : toggle dumping the network in Verilog [default = %s]\n",pcVar3);
        if (fVerbose == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        return 1;
      }
      fSkipSimple = fSkipSimple ^ 1;
    }
  }
  if (pAbc->pNdr == (void *)0x0) {
    if (globalUtilOptind + 1 == argc) {
      pcVar3 = argv[globalUtilOptind];
      __stream = fopen(pcVar3,"r");
      if (__stream != (FILE *)0x0) {
        fclose(__stream);
        Wln_NtkRetimeTest(pcVar3,fSkipSimple,fDump,fVerbose);
        return 0;
      }
      Abc_Print(1,"Cannot open input file \"%s\". ",pcVar3);
      pcVar3 = Extra_FileGetSimilarName
                         (pcVar3,".ndr",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      if (pcVar3 != (char *)0x0) {
        Abc_Print(1,"Did you mean \"%s\"?",pcVar3);
      }
      Abc_Print(1,"\n");
      return 0;
    }
    pcVar3 = "Abc_CommandRetime(): Input file name should be given on the command line.";
  }
  else {
    pNtk = Wln_NtkFromNdr(pAbc->pNdr,fDump);
    Wln_NtkRetimeCreateDelayInfo(pNtk);
    if (pNtk != (Wln_Ntk_t *)0x0) {
      __ptr = Wln_NtkRetime(pNtk,fSkipSimple,fVerbose);
      Wln_NtkFree(pNtk);
      if (pAbc->pNdrArray != (int *)0x0) {
        free(pAbc->pNdrArray);
        pAbc->pNdrArray = (int *)0x0;
      }
      if (__ptr != (Vec_Int_t *)0x0) {
        iVar1 = __ptr->nSize;
        __src = __ptr->pArray;
        piVar2 = (int *)malloc((long)iVar1 * 4 + 4);
        *piVar2 = iVar1 + 1;
        memcpy(piVar2 + 1,__src,(long)iVar1 << 2);
        pAbc->pNdrArray = piVar2;
        if (__src != (int *)0x0) {
          free(__src);
        }
        free(__ptr);
        return 0;
      }
      return 0;
    }
    pcVar3 = "Transforming NDR into internal represnetation has failed.";
  }
  puts(pcVar3);
  return 0;
}

Assistant:

int Abc_CommandRetime( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Wln_NtkRetimeTest( char * pFileName, int fSkipSimple, int fDump, int fVerbose );
    FILE * pFile;
    char * pFileName = NULL;
    int fSkipSimple  = 0;
    int c, fDump = 0, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "sdvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 's':
            fSkipSimple ^= 1;
            break;
        case 'd':
            fDump ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pNdr )
    {
        Vec_Int_t * vMoves;
        Wln_Ntk_t * pNtk = Wln_NtkFromNdr( pAbc->pNdr, fDump );
        Wln_NtkRetimeCreateDelayInfo( pNtk );
        if ( pNtk == NULL )
        {
            printf( "Transforming NDR into internal represnetation has failed.\n" );
            return 0;
        }
        vMoves = Wln_NtkRetime( pNtk, fSkipSimple, fVerbose );
        Wln_NtkFree( pNtk );
        ABC_FREE( pAbc->pNdrArray );
        if ( vMoves ) pAbc->pNdrArray = Vec_IntReleaseNewArray( vMoves );
        Vec_IntFreeP( &vMoves );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
    {
        printf( "Abc_CommandRetime(): Input file name should be given on the command line.\n" );
        return 0;
    }
    // get the file name
    pFileName = argv[globalUtilOptind];
    if ( (pFile = fopen( pFileName, "r" )) == NULL )
    {
        Abc_Print( 1, "Cannot open input file \"%s\". ", pFileName );
        if ( (pFileName = Extra_FileGetSimilarName( pFileName, ".ndr", NULL, NULL, NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", pFileName );
        Abc_Print( 1, "\n" );
        return 0;
    }
    fclose( pFile );
    Wln_NtkRetimeTest( pFileName, fSkipSimple, fDump, fVerbose );
    return 0;
usage:
    Abc_Print( -2, "usage: %%retime [-sdvh]\n" );
    Abc_Print( -2, "\t         performs retiming for the NDR design\n" );
    Abc_Print( -2, "\t-s     : toggle printing simple nodes [default = %s]\n", !fSkipSimple? "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle dumping the network in Verilog [default = %s]\n", fDump? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}